

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> instruction,Context *context)

{
  uint16_t *puVar1;
  Registers *pRVar2;
  Segments *pSVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  short local_24 [2];
  
  uVar4 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                    (context);
  uVar5 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                    (context);
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + *(short *)((long)local_24 + (ulong)((uint)((ulong)instruction >> 0xc) & 2));
  pRVar2 = (context->flow_controller).registers_;
  pRVar2->cs_ = uVar5;
  pSVar3 = (context->flow_controller).segments_;
  pSVar3->cs_base_ = (uint)pSVar3->registers_->cs_ << 4;
  pRVar2->ip_ = uVar4;
  return;
}

Assistant:

void ret_far(
	InstructionT instruction,
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(uint16_t) * 2);
	const auto ip = pop<uint16_t, true>(context);
	const auto cs = pop<uint16_t, true>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(cs, ip);
}